

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O3

void secp256k1_sha256_write(secp256k1_sha256 *hash,uchar *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  size_t __n;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  ulong local_a8;
  
  uVar35 = (ulong)((uint)hash->bytes & 0x3f);
  hash->bytes = hash->bytes + len;
  __n = 0x40 - uVar35;
  local_a8 = uVar35;
  if (__n <= len) {
    local_a8 = 0;
    do {
      memcpy(hash->buf + uVar35,data,__n);
      data = data + __n;
      len = len - __n;
      uVar1 = hash->s[0];
      uVar2 = hash->s[1];
      uVar3 = hash->s[2];
      uVar4 = hash->s[3];
      uVar5 = hash->s[4];
      uVar6 = hash->s[5];
      uVar7 = hash->s[6];
      uVar8 = hash->s[7];
      uVar10 = *(uint *)hash->buf;
      uVar46 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      iVar11 = ((uVar7 ^ uVar6) & uVar5 ^ uVar7) + uVar8 +
               ((uVar5 << 7 | uVar5 >> 0x19) ^
               (uVar5 << 0x15 | uVar5 >> 0xb) ^ (uVar5 << 0x1a | uVar5 >> 6));
      uVar9 = ((uVar2 | uVar1) & uVar3 | uVar2 & uVar1) +
              ((uVar1 << 10 | uVar1 >> 0x16) ^
              (uVar1 << 0x13 | uVar1 >> 0xd) ^ (uVar1 << 0x1e | uVar1 >> 2)) +
              uVar46 + iVar11 + 0x428a2f98;
      uVar47 = uVar4 + iVar11 + uVar46 + 0x428a2f98;
      uVar10 = *(uint *)(hash->buf + 4);
      uVar22 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8;
      uVar15 = uVar22 | uVar10 << 0x18;
      iVar11 = ((uVar6 ^ uVar5) & uVar47 ^ uVar6) + uVar15 + uVar7;
      uVar16 = (uVar47 * 0x80 | uVar47 >> 0x19) ^
               (uVar47 * 0x200000 | uVar47 >> 0xb) ^ (uVar47 * 0x4000000 | uVar47 >> 6);
      uVar17 = uVar3 + iVar11 + uVar16 + 0x71374491;
      uVar24 = ((uVar9 | uVar1) & uVar2 | uVar9 & uVar1) +
               ((uVar9 * 0x400 | uVar9 >> 0x16) ^
               (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) +
               iVar11 + uVar16 + 0x71374491;
      uVar12 = (uVar17 * 0x80 | uVar17 >> 0x19) ^
               (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6);
      uVar16 = *(uint *)(hash->buf + 8);
      uVar23 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8;
      uVar36 = uVar23 | uVar16 << 0x18;
      iVar11 = ((uVar47 ^ uVar5) & uVar17 ^ uVar5) + uVar36 + uVar6;
      uVar32 = ((uVar24 | uVar9) & uVar1 | uVar24 & uVar9) +
               ((uVar24 * 0x400 | uVar24 >> 0x16) ^
               (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) +
               uVar12 + iVar11 + -0x4a3f0431;
      uVar13 = uVar2 + iVar11 + uVar12 + 0xb5c0fbcf;
      uVar37 = (uVar13 * 0x80 | uVar13 >> 0x19) ^
               (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6);
      uVar12 = *(uint *)(hash->buf + 0xc);
      uVar34 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8;
      uVar52 = uVar34 | uVar12 << 0x18;
      iVar11 = ((uVar17 ^ uVar47) & uVar13 ^ uVar47) + uVar5 + uVar52;
      uVar42 = ((uVar32 | uVar24) & uVar9 | uVar32 & uVar24) +
               ((uVar32 * 0x400 | uVar32 >> 0x16) ^
               (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) +
               uVar37 + iVar11 + -0x164a245b;
      uVar38 = uVar1 + iVar11 + uVar37 + 0xe9b5dba5;
      uVar37 = *(uint *)(hash->buf + 0x10);
      uVar51 = uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8;
      uVar19 = uVar51 | uVar37 << 0x18;
      iVar11 = uVar47 + uVar19 + ((uVar13 ^ uVar17) & uVar38 ^ uVar17) +
               ((uVar38 * 0x80 | uVar38 >> 0x19) ^
               (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
               0x3956c25b;
      uVar9 = uVar9 + iVar11;
      uVar53 = ((uVar42 | uVar32) & uVar24 | uVar42 & uVar32) +
               ((uVar42 * 0x400 | uVar42 >> 0x16) ^
               (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar11;
      uVar47 = *(uint *)(hash->buf + 0x14);
      uVar54 = uVar47 >> 0x18 | (uVar47 & 0xff0000) >> 8 | (uVar47 & 0xff00) << 8;
      uVar20 = uVar54 | uVar47 << 0x18;
      iVar11 = uVar17 + uVar20 + ((uVar38 ^ uVar13) & uVar9 ^ uVar13) +
               ((uVar9 * 0x80 | uVar9 >> 0x19) ^
               (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + 0x59f111f1;
      uVar24 = uVar24 + iVar11;
      uVar21 = ((uVar53 | uVar42) & uVar32 | uVar53 & uVar42) +
               ((uVar53 * 0x400 | uVar53 >> 0x16) ^
               (uVar53 * 0x80000 | uVar53 >> 0xd) ^ (uVar53 * 0x40000000 | uVar53 >> 2)) + iVar11;
      uVar17 = *(uint *)(hash->buf + 0x18);
      uVar55 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8;
      uVar48 = uVar55 | uVar17 << 0x18;
      iVar11 = uVar13 + uVar48 + ((uVar9 ^ uVar38) & uVar24 ^ uVar38) +
               ((uVar24 * 0x80 | uVar24 >> 0x19) ^
               (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6)) +
               -0x6dc07d5c;
      uVar32 = uVar32 + iVar11;
      uVar18 = ((uVar21 | uVar53) & uVar42 | uVar21 & uVar53) +
               ((uVar21 * 0x400 | uVar21 >> 0x16) ^
               (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar11;
      uVar13 = *(uint *)(hash->buf + 0x1c);
      uVar56 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8;
      uVar49 = uVar56 | uVar13 << 0x18;
      iVar11 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
               (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
               uVar38 + uVar49 + ((uVar24 ^ uVar9) & uVar32 ^ uVar9) + -0x54e3a12b;
      uVar42 = uVar42 + iVar11;
      uVar50 = ((uVar18 | uVar21) & uVar53 | uVar18 & uVar21) +
               ((uVar18 * 0x400 | uVar18 >> 0x16) ^
               (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar11;
      uVar38 = *(uint *)(hash->buf + 0x20);
      uVar58 = uVar38 >> 0x18 | (uVar38 & 0xff0000) >> 8 | (uVar38 & 0xff00) << 8;
      uVar39 = uVar58 | uVar38 << 0x18;
      iVar11 = uVar9 + uVar39 + ((uVar32 ^ uVar24) & uVar42 ^ uVar24) +
               ((uVar42 * 0x80 | uVar42 >> 0x19) ^
               (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
               -0x27f85568;
      uVar53 = uVar53 + iVar11;
      uVar14 = ((uVar50 | uVar18) & uVar21 | uVar50 & uVar18) +
               ((uVar50 * 0x400 | uVar50 >> 0x16) ^
               (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar11;
      uVar9 = *(uint *)(hash->buf + 0x24);
      uVar59 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8;
      uVar40 = uVar59 | uVar9 << 0x18;
      iVar11 = ((uVar53 * 0x80 | uVar53 >> 0x19) ^
               (uVar53 * 0x200000 | uVar53 >> 0xb) ^ (uVar53 * 0x4000000 | uVar53 >> 6)) +
               uVar24 + uVar40 + ((uVar42 ^ uVar32) & uVar53 ^ uVar32) + 0x12835b01;
      uVar21 = uVar21 + iVar11;
      uVar41 = ((uVar14 | uVar50) & uVar18 | uVar14 & uVar50) +
               ((uVar14 * 0x400 | uVar14 >> 0x16) ^
               (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar11;
      uVar24 = *(uint *)(hash->buf + 0x28);
      uVar60 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8;
      uVar25 = uVar60 | uVar24 << 0x18;
      iVar11 = ((uVar21 * 0x80 | uVar21 >> 0x19) ^
               (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6)) +
               uVar32 + uVar25 + ((uVar53 ^ uVar42) & uVar21 ^ uVar42) + 0x243185be;
      uVar18 = uVar18 + iVar11;
      uVar57 = ((uVar41 | uVar14) & uVar50 | uVar41 & uVar14) +
               ((uVar41 * 0x400 | uVar41 >> 0x16) ^
               (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar11;
      uVar32 = *(uint *)(hash->buf + 0x2c);
      uVar61 = uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8;
      uVar26 = uVar61 | uVar32 << 0x18;
      iVar11 = ((uVar18 * 0x80 | uVar18 >> 0x19) ^
               (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) +
               uVar42 + uVar26 + ((uVar21 ^ uVar53) & uVar18 ^ uVar53) + 0x550c7dc3;
      uVar50 = uVar50 + iVar11;
      uVar43 = ((uVar57 | uVar41) & uVar14 | uVar57 & uVar41) +
               ((uVar57 * 0x400 | uVar57 >> 0x16) ^
               (uVar57 * 0x80000 | uVar57 >> 0xd) ^ (uVar57 * 0x40000000 | uVar57 >> 2)) + iVar11;
      uVar42 = *(uint *)(hash->buf + 0x30);
      uVar62 = uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8;
      uVar27 = uVar62 | uVar42 << 0x18;
      iVar11 = ((uVar50 * 0x80 | uVar50 >> 0x19) ^
               (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) +
               uVar53 + uVar27 + ((uVar18 ^ uVar21) & uVar50 ^ uVar21) + 0x72be5d74;
      uVar14 = uVar14 + iVar11;
      uVar44 = ((uVar43 | uVar57) & uVar41 | uVar43 & uVar57) +
               ((uVar43 * 0x400 | uVar43 >> 0x16) ^
               (uVar43 * 0x80000 | uVar43 >> 0xd) ^ (uVar43 * 0x40000000 | uVar43 >> 2)) + iVar11;
      uVar53 = *(uint *)(hash->buf + 0x34);
      uVar63 = uVar53 >> 0x18 | (uVar53 & 0xff0000) >> 8 | (uVar53 & 0xff00) << 8;
      uVar28 = uVar63 | uVar53 << 0x18;
      iVar11 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
               (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
               uVar21 + uVar28 + ((uVar50 ^ uVar18) & uVar14 ^ uVar18) + -0x7f214e02;
      uVar41 = uVar41 + iVar11;
      uVar64 = ((uVar44 | uVar43) & uVar57 | uVar44 & uVar43) +
               ((uVar44 * 0x400 | uVar44 >> 0x16) ^
               (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar11;
      uVar29 = (uint)hash->buf[0x39] << 0x10 | (uint)hash->buf[0x38] << 0x18;
      uVar45 = (uint)hash->buf[0x3a] << 8 | uVar29;
      uVar30 = hash->buf[0x3b] | uVar45;
      iVar11 = ((uVar41 * 0x80 | uVar41 >> 0x19) ^
               (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6)) +
               uVar18 + uVar30 + ((uVar14 ^ uVar50) & uVar41 ^ uVar50) + -0x6423f959;
      uVar57 = uVar57 + iVar11;
      uVar33 = ((uVar64 | uVar44) & uVar43 | uVar64 & uVar44) +
               ((uVar64 * 0x400 | uVar64 >> 0x16) ^
               (uVar64 * 0x80000 | uVar64 >> 0xd) ^ (uVar64 * 0x40000000 | uVar64 >> 2)) + iVar11;
      uVar21 = (uint)hash->buf[0x3d] << 0x10 | (uint)hash->buf[0x3c] << 0x18;
      uVar18 = (uint)hash->buf[0x3e] << 8 | uVar21;
      uVar31 = hash->buf[0x3f] | uVar18;
      iVar11 = ((uVar57 * 0x80 | uVar57 >> 0x19) ^
               (uVar57 * 0x200000 | uVar57 >> 0xb) ^ (uVar57 * 0x4000000 | uVar57 >> 6)) +
               uVar50 + uVar31 + ((uVar41 ^ uVar14) & uVar57 ^ uVar14) + -0x3e640e8c;
      uVar43 = uVar43 + iVar11;
      uVar50 = ((uVar33 | uVar64) & uVar44 | uVar33 & uVar64) +
               ((uVar33 * 0x400 | uVar33 >> 0x16) ^
               (uVar33 * 0x80000 | uVar33 >> 0xd) ^ (uVar33 * 0x40000000 | uVar33 >> 2)) + iVar11;
      uVar45 = uVar46 + uVar40 +
               (uVar15 >> 3 ^
               (uVar22 << 0xe | uVar15 >> 0x12) ^ ((uVar10 >> 0x18) << 0x19 | uVar15 >> 7)) +
               (uVar45 >> 10 ^ (uVar30 << 0xd | uVar29 >> 0x13) ^ (uVar30 << 0xf | uVar29 >> 0x11));
      iVar11 = uVar14 + uVar45 + ((uVar57 ^ uVar41) & uVar43 ^ uVar41) +
               ((uVar43 * 0x80 | uVar43 >> 0x19) ^
               (uVar43 * 0x200000 | uVar43 >> 0xb) ^ (uVar43 * 0x4000000 | uVar43 >> 6)) +
               -0x1b64963f;
      uVar44 = uVar44 + iVar11;
      uVar14 = ((uVar50 | uVar33) & uVar64 | uVar50 & uVar33) +
               ((uVar50 * 0x400 | uVar50 >> 0x16) ^
               (uVar50 * 0x80000 | uVar50 >> 0xd) ^ (uVar50 * 0x40000000 | uVar50 >> 2)) + iVar11;
      uVar18 = uVar15 + uVar25 +
               (uVar36 >> 3 ^
               (uVar23 << 0xe | uVar36 >> 0x12) ^ ((uVar16 >> 0x18) << 0x19 | uVar36 >> 7)) +
               (uVar18 >> 10 ^ (uVar31 << 0xd | uVar21 >> 0x13) ^ (uVar31 << 0xf | uVar21 >> 0x11));
      iVar11 = ((uVar44 * 0x80 | uVar44 >> 0x19) ^
               (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6)) +
               uVar41 + uVar18 + ((uVar43 ^ uVar57) & uVar44 ^ uVar57) + -0x1041b87a;
      uVar64 = uVar64 + iVar11;
      uVar15 = ((uVar14 | uVar50) & uVar33 | uVar14 & uVar50) +
               ((uVar14 * 0x400 | uVar14 >> 0x16) ^
               (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar11;
      uVar41 = uVar36 + uVar26 +
               (uVar52 >> 3 ^
               (uVar34 << 0xe | uVar52 >> 0x12) ^ ((uVar12 >> 0x18) << 0x19 | uVar52 >> 7)) +
               (uVar45 >> 10 ^
               (uVar45 * 0x2000 | uVar45 >> 0x13) ^ (uVar45 * 0x8000 | uVar45 >> 0x11));
      iVar11 = ((uVar64 * 0x80 | uVar64 >> 0x19) ^
               (uVar64 * 0x200000 | uVar64 >> 0xb) ^ (uVar64 * 0x4000000 | uVar64 >> 6)) +
               uVar57 + uVar41 + ((uVar44 ^ uVar43) & uVar64 ^ uVar43) + 0xfc19dc6;
      uVar33 = uVar33 + iVar11;
      uVar36 = ((uVar15 | uVar14) & uVar50 | uVar15 & uVar14) +
               ((uVar15 * 0x400 | uVar15 >> 0x16) ^
               (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar11;
      uVar22 = uVar52 + uVar27 +
               (uVar19 >> 3 ^
               (uVar51 << 0xe | uVar19 >> 0x12) ^ ((uVar37 >> 0x18) << 0x19 | uVar19 >> 7)) +
               (uVar18 >> 10 ^
               (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11));
      iVar11 = ((uVar33 * 0x80 | uVar33 >> 0x19) ^
               (uVar33 * 0x200000 | uVar33 >> 0xb) ^ (uVar33 * 0x4000000 | uVar33 >> 6)) +
               uVar43 + uVar22 + ((uVar64 ^ uVar44) & uVar33 ^ uVar44) + 0x240ca1cc;
      uVar50 = uVar50 + iVar11;
      uVar16 = ((uVar36 | uVar15) & uVar14 | uVar36 & uVar15) +
               ((uVar36 * 0x400 | uVar36 >> 0x16) ^
               (uVar36 * 0x80000 | uVar36 >> 0xd) ^ (uVar36 * 0x40000000 | uVar36 >> 2)) + iVar11;
      uVar23 = uVar19 + uVar28 +
               (uVar20 >> 3 ^
               (uVar54 << 0xe | uVar20 >> 0x12) ^ ((uVar47 >> 0x18) << 0x19 | uVar20 >> 7)) +
               (uVar41 >> 10 ^
               (uVar41 * 0x2000 | uVar41 >> 0x13) ^ (uVar41 * 0x8000 | uVar41 >> 0x11));
      iVar11 = ((uVar50 * 0x80 | uVar50 >> 0x19) ^
               (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6)) +
               uVar44 + uVar23 + ((uVar33 ^ uVar64) & uVar50 ^ uVar64) + 0x2de92c6f;
      uVar14 = uVar14 + iVar11;
      uVar37 = ((uVar16 | uVar36) & uVar15 | uVar16 & uVar36) +
               ((uVar16 * 0x400 | uVar16 >> 0x16) ^
               (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar11;
      uVar12 = uVar20 + uVar30 +
               (uVar48 >> 3 ^
               (uVar55 << 0xe | uVar48 >> 0x12) ^ ((uVar17 >> 0x18) << 0x19 | uVar48 >> 7)) +
               (uVar22 >> 10 ^
               (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
      iVar11 = ((uVar14 * 0x80 | uVar14 >> 0x19) ^
               (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6)) +
               uVar64 + uVar12 + ((uVar50 ^ uVar33) & uVar14 ^ uVar33) + 0x4a7484aa;
      uVar15 = uVar15 + iVar11;
      uVar34 = ((uVar37 | uVar16) & uVar36 | uVar37 & uVar16) +
               ((uVar37 * 0x400 | uVar37 >> 0x16) ^
               (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar11;
      uVar17 = uVar48 + uVar31 +
               (uVar49 >> 3 ^
               (uVar56 << 0xe | uVar49 >> 0x12) ^ ((uVar13 >> 0x18) << 0x19 | uVar49 >> 7)) +
               (uVar23 >> 10 ^
               (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11));
      iVar11 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
               (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
               uVar33 + uVar17 + ((uVar14 ^ uVar50) & uVar15 ^ uVar50) + 0x5cb0a9dc;
      uVar36 = uVar36 + iVar11;
      uVar13 = ((uVar34 | uVar37) & uVar16 | uVar34 & uVar37) +
               ((uVar34 * 0x400 | uVar34 >> 0x16) ^
               (uVar34 * 0x80000 | uVar34 >> 0xd) ^ (uVar34 * 0x40000000 | uVar34 >> 2)) + iVar11;
      uVar64 = (uVar39 >> 3 ^
               (uVar58 << 0xe | uVar39 >> 0x12) ^ ((uVar38 >> 0x18) << 0x19 | uVar39 >> 7)) + uVar49
               + uVar45 +
               (uVar12 >> 10 ^
               (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11));
      iVar11 = ((uVar36 * 0x80 | uVar36 >> 0x19) ^
               (uVar36 * 0x200000 | uVar36 >> 0xb) ^ (uVar36 * 0x4000000 | uVar36 >> 6)) +
               uVar50 + uVar64 + ((uVar15 ^ uVar14) & uVar36 ^ uVar14) + 0x76f988da;
      uVar16 = uVar16 + iVar11;
      uVar10 = ((uVar13 | uVar34) & uVar37 | uVar13 & uVar34) +
               ((uVar13 * 0x400 | uVar13 >> 0x16) ^
               (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar11;
      uVar55 = (uVar40 >> 3 ^
               (uVar59 << 0xe | uVar40 >> 0x12) ^ ((uVar9 >> 0x18) << 0x19 | uVar40 >> 7)) + uVar39
               + uVar18 +
               (uVar17 >> 10 ^
               (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11));
      iVar11 = ((uVar16 * 0x80 | uVar16 >> 0x19) ^
               (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
               uVar14 + uVar55 + ((uVar36 ^ uVar15) & uVar16 ^ uVar15) + -0x67c1aeae;
      uVar37 = uVar37 + iVar11;
      uVar47 = ((uVar10 | uVar13) & uVar34 | uVar10 & uVar13) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar11;
      uVar9 = (uVar25 >> 3 ^
              (uVar60 << 0xe | uVar25 >> 0x12) ^ ((uVar24 >> 0x18) << 0x19 | uVar25 >> 7)) + uVar40
              + uVar41 +
              (uVar64 >> 10 ^
              (uVar64 * 0x2000 | uVar64 >> 0x13) ^ (uVar64 * 0x8000 | uVar64 >> 0x11));
      iVar11 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
               (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
               uVar15 + uVar9 + ((uVar16 ^ uVar36) & uVar37 ^ uVar36) + -0x57ce3993;
      uVar34 = uVar34 + iVar11;
      uVar54 = ((uVar47 | uVar10) & uVar13 | uVar47 & uVar10) +
               ((uVar47 * 0x400 | uVar47 >> 0x16) ^
               (uVar47 * 0x80000 | uVar47 >> 0xd) ^ (uVar47 * 0x40000000 | uVar47 >> 2)) + iVar11;
      uVar24 = (uVar26 >> 3 ^
               (uVar61 << 0xe | uVar26 >> 0x12) ^ ((uVar32 >> 0x18) << 0x19 | uVar26 >> 7)) + uVar25
               + uVar22 +
               (uVar55 >> 10 ^
               (uVar55 * 0x2000 | uVar55 >> 0x13) ^ (uVar55 * 0x8000 | uVar55 >> 0x11));
      iVar11 = ((uVar34 * 0x80 | uVar34 >> 0x19) ^
               (uVar34 * 0x200000 | uVar34 >> 0xb) ^ (uVar34 * 0x4000000 | uVar34 >> 6)) +
               uVar36 + uVar24 + ((uVar37 ^ uVar16) & uVar34 ^ uVar16) + -0x4ffcd838;
      uVar13 = uVar13 + iVar11;
      uVar51 = ((uVar54 | uVar47) & uVar10 | uVar54 & uVar47) +
               ((uVar54 * 0x400 | uVar54 >> 0x16) ^
               (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar11;
      uVar14 = (uVar27 >> 3 ^
               (uVar62 << 0xe | uVar27 >> 0x12) ^ ((uVar42 >> 0x18) << 0x19 | uVar27 >> 7)) + uVar26
               + uVar23 +
               (uVar9 >> 10 ^ (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11));
      iVar11 = uVar16 + uVar14 + ((uVar34 ^ uVar37) & uVar13 ^ uVar37) +
               ((uVar13 * 0x80 | uVar13 >> 0x19) ^
               (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
               -0x40a68039;
      uVar10 = uVar10 + iVar11;
      uVar32 = ((uVar51 | uVar54) & uVar47 | uVar51 & uVar54) +
               ((uVar51 * 0x400 | uVar51 >> 0x16) ^
               (uVar51 * 0x80000 | uVar51 >> 0xd) ^ (uVar51 * 0x40000000 | uVar51 >> 2)) + iVar11;
      uVar53 = (uVar28 >> 3 ^
               (uVar63 << 0xe | uVar28 >> 0x12) ^ ((uVar53 >> 0x18) << 0x19 | uVar28 >> 7)) + uVar27
               + uVar12 +
               (uVar24 >> 10 ^
               (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
      iVar11 = uVar37 + uVar53 + ((uVar13 ^ uVar34) & uVar10 ^ uVar34) +
               ((uVar10 * 0x80 | uVar10 >> 0x19) ^
               (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
               -0x391ff40d;
      uVar47 = uVar47 + iVar11;
      uVar16 = ((uVar32 | uVar51) & uVar54 | uVar32 & uVar51) +
               ((uVar32 * 0x400 | uVar32 >> 0x16) ^
               (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar11;
      uVar15 = (uVar30 >> 3 ^
               (uVar30 << 0xe | uVar29 >> 0x12) ^ ((uint)hash->buf[0x3b] << 0x19 | uVar30 >> 7)) +
               uVar28 + uVar17 +
               (uVar14 >> 10 ^
               (uVar14 * 0x2000 | uVar14 >> 0x13) ^ (uVar14 * 0x8000 | uVar14 >> 0x11));
      iVar11 = ((uVar47 * 0x80 | uVar47 >> 0x19) ^
               (uVar47 * 0x200000 | uVar47 >> 0xb) ^ (uVar47 * 0x4000000 | uVar47 >> 6)) +
               uVar34 + uVar15 + ((uVar10 ^ uVar13) & uVar47 ^ uVar13) + -0x2a586eb9;
      uVar54 = uVar54 + iVar11;
      uVar38 = ((uVar16 | uVar32) & uVar51 | uVar16 & uVar32) +
               ((uVar16 * 0x400 | uVar16 >> 0x16) ^
               (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar11;
      uVar58 = (uVar31 >> 3 ^
               (uVar31 << 0xe | uVar21 >> 0x12) ^ ((uint)hash->buf[0x3f] << 0x19 | uVar31 >> 7)) +
               uVar30 + uVar64 +
               (uVar53 >> 10 ^
               (uVar53 * 0x2000 | uVar53 >> 0x13) ^ (uVar53 * 0x8000 | uVar53 >> 0x11));
      iVar11 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
               (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
               uVar13 + uVar58 + ((uVar47 ^ uVar10) & uVar54 ^ uVar10) + 0x6ca6351;
      uVar51 = uVar51 + iVar11;
      uVar13 = ((uVar38 | uVar16) & uVar32 | uVar38 & uVar16) +
               ((uVar38 * 0x400 | uVar38 >> 0x16) ^
               (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar11;
      uVar56 = (uVar45 >> 3 ^
               (uVar45 * 0x4000 | uVar45 >> 0x12) ^ (uVar45 * 0x2000000 | uVar45 >> 7)) + uVar31 +
               uVar55 + (uVar15 >> 10 ^
                        (uVar15 * 0x2000 | uVar15 >> 0x13) ^ (uVar15 * 0x8000 | uVar15 >> 0x11));
      iVar11 = uVar10 + uVar56 + ((uVar54 ^ uVar47) & uVar51 ^ uVar47) +
               ((uVar51 * 0x80 | uVar51 >> 0x19) ^
               (uVar51 * 0x200000 | uVar51 >> 0xb) ^ (uVar51 * 0x4000000 | uVar51 >> 6)) +
               0x14292967;
      uVar32 = uVar32 + iVar11;
      uVar10 = ((uVar13 | uVar38) & uVar16 | uVar13 & uVar38) +
               ((uVar13 * 0x400 | uVar13 >> 0x16) ^
               (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar11;
      uVar59 = (uVar18 >> 3 ^
               (uVar18 * 0x4000 | uVar18 >> 0x12) ^ (uVar18 * 0x2000000 | uVar18 >> 7)) + uVar45 +
               uVar9 + (uVar58 >> 10 ^
                       (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11));
      iVar11 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
               (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
               uVar47 + uVar59 + ((uVar51 ^ uVar54) & uVar32 ^ uVar54) + 0x27b70a85;
      uVar16 = uVar16 + iVar11;
      uVar47 = ((uVar10 | uVar13) & uVar38 | uVar10 & uVar13) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar11;
      uVar60 = (uVar41 >> 3 ^
               (uVar41 * 0x4000 | uVar41 >> 0x12) ^ (uVar41 * 0x2000000 | uVar41 >> 7)) + uVar18 +
               uVar24 + (uVar56 >> 10 ^
                        (uVar56 * 0x2000 | uVar56 >> 0x13) ^ (uVar56 * 0x8000 | uVar56 >> 0x11));
      iVar11 = ((uVar16 * 0x80 | uVar16 >> 0x19) ^
               (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
               uVar54 + uVar60 + ((uVar32 ^ uVar51) & uVar16 ^ uVar51) + 0x2e1b2138;
      uVar38 = uVar38 + iVar11;
      uVar54 = ((uVar47 | uVar10) & uVar13 | uVar47 & uVar10) +
               ((uVar47 * 0x400 | uVar47 >> 0x16) ^
               (uVar47 * 0x80000 | uVar47 >> 0xd) ^ (uVar47 * 0x40000000 | uVar47 >> 2)) + iVar11;
      uVar34 = (uVar22 >> 3 ^
               (uVar22 * 0x4000 | uVar22 >> 0x12) ^ (uVar22 * 0x2000000 | uVar22 >> 7)) + uVar41 +
               uVar14 + (uVar59 >> 10 ^
                        (uVar59 * 0x2000 | uVar59 >> 0x13) ^ (uVar59 * 0x8000 | uVar59 >> 0x11));
      iVar11 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
               (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
               uVar51 + uVar34 + ((uVar16 ^ uVar32) & uVar38 ^ uVar32) + 0x4d2c6dfc;
      uVar13 = uVar13 + iVar11;
      uVar42 = ((uVar54 | uVar47) & uVar10 | uVar54 & uVar47) +
               ((uVar54 * 0x400 | uVar54 >> 0x16) ^
               (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar11;
      uVar18 = (uVar23 >> 3 ^
               (uVar23 * 0x4000 | uVar23 >> 0x12) ^ (uVar23 * 0x2000000 | uVar23 >> 7)) + uVar22 +
               uVar53 + (uVar60 >> 10 ^
                        (uVar60 * 0x2000 | uVar60 >> 0x13) ^ (uVar60 * 0x8000 | uVar60 >> 0x11));
      iVar11 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
               (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
               uVar32 + uVar18 + ((uVar38 ^ uVar16) & uVar13 ^ uVar16) + 0x53380d13;
      uVar10 = uVar10 + iVar11;
      uVar37 = ((uVar42 | uVar54) & uVar47 | uVar42 & uVar54) +
               ((uVar42 * 0x400 | uVar42 >> 0x16) ^
               (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar11;
      uVar51 = (uVar12 >> 3 ^
               (uVar12 * 0x4000 | uVar12 >> 0x12) ^ (uVar12 * 0x2000000 | uVar12 >> 7)) + uVar23 +
               uVar15 + (uVar34 >> 10 ^
                        (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11));
      iVar11 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
               (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
               uVar16 + uVar51 + ((uVar13 ^ uVar38) & uVar10 ^ uVar38) + 0x650a7354;
      uVar47 = uVar47 + iVar11;
      uVar32 = ((uVar37 | uVar42) & uVar54 | uVar37 & uVar42) +
               ((uVar37 * 0x400 | uVar37 >> 0x16) ^
               (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar11;
      uVar61 = (uVar17 >> 3 ^
               (uVar17 * 0x4000 | uVar17 >> 0x12) ^ (uVar17 * 0x2000000 | uVar17 >> 7)) + uVar12 +
               uVar58 + (uVar18 >> 10 ^
                        (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11));
      iVar11 = ((uVar47 * 0x80 | uVar47 >> 0x19) ^
               (uVar47 * 0x200000 | uVar47 >> 0xb) ^ (uVar47 * 0x4000000 | uVar47 >> 6)) +
               uVar38 + uVar61 + ((uVar10 ^ uVar13) & uVar47 ^ uVar13) + 0x766a0abb;
      uVar54 = uVar54 + iVar11;
      uVar23 = ((uVar32 | uVar37) & uVar42 | uVar32 & uVar37) +
               ((uVar32 * 0x400 | uVar32 >> 0x16) ^
               (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar11;
      uVar62 = (uVar64 >> 3 ^
               (uVar64 * 0x4000 | uVar64 >> 0x12) ^ (uVar64 * 0x2000000 | uVar64 >> 7)) + uVar17 +
               uVar56 + (uVar51 >> 10 ^
                        (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11));
      iVar11 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
               (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
               uVar13 + uVar62 + ((uVar47 ^ uVar10) & uVar54 ^ uVar10) + -0x7e3d36d2;
      uVar42 = uVar42 + iVar11;
      uVar12 = ((uVar23 | uVar32) & uVar37 | uVar23 & uVar32) +
               ((uVar23 * 0x400 | uVar23 >> 0x16) ^
               (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar11;
      uVar21 = (uVar55 >> 3 ^
               (uVar55 * 0x4000 | uVar55 >> 0x12) ^ (uVar55 * 0x2000000 | uVar55 >> 7)) + uVar64 +
               uVar59 + (uVar61 >> 10 ^
                        (uVar61 * 0x2000 | uVar61 >> 0x13) ^ (uVar61 * 0x8000 | uVar61 >> 0x11));
      iVar11 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
               (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
               uVar10 + uVar21 + ((uVar54 ^ uVar47) & uVar42 ^ uVar47) + -0x6d8dd37b;
      uVar37 = uVar37 + iVar11;
      uVar38 = ((uVar12 | uVar23) & uVar32 | uVar12 & uVar23) +
               ((uVar12 * 0x400 | uVar12 >> 0x16) ^
               (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar11;
      uVar64 = (uVar9 >> 3 ^ (uVar9 * 0x4000 | uVar9 >> 0x12) ^ (uVar9 * 0x2000000 | uVar9 >> 7)) +
               uVar55 + uVar60 +
               (uVar62 >> 10 ^
               (uVar62 * 0x2000 | uVar62 >> 0x13) ^ (uVar62 * 0x8000 | uVar62 >> 0x11));
      iVar11 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
               (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
               uVar47 + uVar64 + ((uVar42 ^ uVar54) & uVar37 ^ uVar54) + -0x5d40175f;
      uVar32 = uVar32 + iVar11;
      uVar10 = ((uVar38 | uVar12) & uVar23 | uVar38 & uVar12) +
               ((uVar38 * 0x400 | uVar38 >> 0x16) ^
               (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar11;
      uVar47 = (uVar24 >> 3 ^
               (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7)) + uVar9 +
               uVar34 + (uVar21 >> 10 ^
                        (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11));
      iVar11 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
               (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
               uVar54 + uVar47 + ((uVar37 ^ uVar42) & uVar32 ^ uVar42) + -0x57e599b5;
      uVar23 = uVar23 + iVar11;
      uVar16 = ((uVar10 | uVar38) & uVar12 | uVar10 & uVar38) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar11;
      uVar19 = (uVar14 >> 3 ^
               (uVar14 * 0x4000 | uVar14 >> 0x12) ^ (uVar14 * 0x2000000 | uVar14 >> 7)) + uVar24 +
               uVar18 + (uVar64 >> 10 ^
                        (uVar64 * 0x2000 | uVar64 >> 0x13) ^ (uVar64 * 0x8000 | uVar64 >> 0x11));
      iVar11 = ((uVar23 * 0x80 | uVar23 >> 0x19) ^
               (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) +
               uVar42 + uVar19 + ((uVar32 ^ uVar37) & uVar23 ^ uVar37) + -0x3db47490;
      uVar12 = uVar12 + iVar11;
      uVar63 = ((uVar16 | uVar10) & uVar38 | uVar16 & uVar10) +
               ((uVar16 * 0x400 | uVar16 >> 0x16) ^
               (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar11;
      uVar17 = (uVar53 >> 3 ^
               (uVar53 * 0x4000 | uVar53 >> 0x12) ^ (uVar53 * 0x2000000 | uVar53 >> 7)) + uVar14 +
               uVar51 + (uVar47 >> 10 ^
                        (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11));
      iVar11 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
               (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
               uVar37 + uVar17 + ((uVar23 ^ uVar32) & uVar12 ^ uVar32) + -0x3893ae5d;
      uVar38 = uVar38 + iVar11;
      uVar13 = ((uVar63 | uVar16) & uVar10 | uVar63 & uVar16) +
               ((uVar63 * 0x400 | uVar63 >> 0x16) ^
               (uVar63 * 0x80000 | uVar63 >> 0xd) ^ (uVar63 * 0x40000000 | uVar63 >> 2)) + iVar11;
      uVar53 = (uVar15 >> 3 ^
               (uVar15 * 0x4000 | uVar15 >> 0x12) ^ (uVar15 * 0x2000000 | uVar15 >> 7)) + uVar53 +
               uVar61 + (uVar19 >> 10 ^
                        (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11));
      iVar11 = ((uVar38 * 0x80 | uVar38 >> 0x19) ^
               (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6)) +
               uVar32 + uVar53 + ((uVar12 ^ uVar23) & uVar38 ^ uVar23) + -0x2e6d17e7;
      uVar10 = uVar10 + iVar11;
      uVar37 = ((uVar13 | uVar63) & uVar16 | uVar13 & uVar63) +
               ((uVar13 * 0x400 | uVar13 >> 0x16) ^
               (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar11;
      uVar22 = (uVar58 >> 3 ^
               (uVar58 * 0x4000 | uVar58 >> 0x12) ^ (uVar58 * 0x2000000 | uVar58 >> 7)) + uVar15 +
               uVar62 + (uVar17 >> 10 ^
                        (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11));
      iVar11 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
               (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
               uVar23 + uVar22 + ((uVar38 ^ uVar12) & uVar10 ^ uVar12) + -0x2966f9dc;
      uVar16 = uVar16 + iVar11;
      uVar32 = ((uVar37 | uVar13) & uVar63 | uVar37 & uVar13) +
               ((uVar37 * 0x400 | uVar37 >> 0x16) ^
               (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar11;
      uVar24 = (uVar56 >> 3 ^
               (uVar56 * 0x4000 | uVar56 >> 0x12) ^ (uVar56 * 0x2000000 | uVar56 >> 7)) + uVar58 +
               uVar21 + (uVar53 >> 10 ^
                        (uVar53 * 0x2000 | uVar53 >> 0x13) ^ (uVar53 * 0x8000 | uVar53 >> 0x11));
      iVar11 = ((uVar16 * 0x80 | uVar16 >> 0x19) ^
               (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
               uVar12 + uVar24 + ((uVar10 ^ uVar38) & uVar16 ^ uVar38) + -0xbf1ca7b;
      uVar63 = uVar63 + iVar11;
      uVar42 = ((uVar32 | uVar37) & uVar13 | uVar32 & uVar37) +
               ((uVar32 * 0x400 | uVar32 >> 0x16) ^
               (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar11;
      uVar23 = (uVar59 >> 3 ^
               (uVar59 * 0x4000 | uVar59 >> 0x12) ^ (uVar59 * 0x2000000 | uVar59 >> 7)) + uVar56 +
               uVar64 + (uVar22 >> 10 ^
                        (uVar22 * 0x2000 | uVar22 >> 0x13) ^ (uVar22 * 0x8000 | uVar22 >> 0x11));
      iVar11 = ((uVar63 * 0x80 | uVar63 >> 0x19) ^
               (uVar63 * 0x200000 | uVar63 >> 0xb) ^ (uVar63 * 0x4000000 | uVar63 >> 6)) +
               uVar38 + uVar23 + ((uVar16 ^ uVar10) & uVar63 ^ uVar10) + 0x106aa070;
      uVar13 = uVar13 + iVar11;
      uVar55 = ((uVar42 | uVar32) & uVar37 | uVar42 & uVar32) +
               ((uVar42 * 0x400 | uVar42 >> 0x16) ^
               (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar11;
      uVar9 = (uVar60 >> 3 ^ (uVar60 * 0x4000 | uVar60 >> 0x12) ^ (uVar60 * 0x2000000 | uVar60 >> 7)
              ) + uVar59 + uVar47 +
              (uVar24 >> 10 ^
              (uVar24 * 0x2000 | uVar24 >> 0x13) ^ (uVar24 * 0x8000 | uVar24 >> 0x11));
      iVar11 = uVar10 + uVar9 + ((uVar63 ^ uVar16) & uVar13 ^ uVar16) +
               ((uVar13 * 0x80 | uVar13 >> 0x19) ^
               (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
               0x19a4c116;
      uVar37 = uVar37 + iVar11;
      uVar54 = ((uVar55 | uVar42) & uVar32 | uVar55 & uVar42) +
               ((uVar55 * 0x400 | uVar55 >> 0x16) ^
               (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar11;
      uVar38 = (uVar34 >> 3 ^
               (uVar34 * 0x4000 | uVar34 >> 0x12) ^ (uVar34 * 0x2000000 | uVar34 >> 7)) + uVar60 +
               uVar19 + (uVar23 >> 10 ^
                        (uVar23 * 0x2000 | uVar23 >> 0x13) ^ (uVar23 * 0x8000 | uVar23 >> 0x11));
      iVar11 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
               (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
               uVar16 + uVar38 + ((uVar13 ^ uVar63) & uVar37 ^ uVar63) + 0x1e376c08;
      uVar32 = uVar32 + iVar11;
      uVar10 = ((uVar54 | uVar55) & uVar42 | uVar54 & uVar55) +
               ((uVar54 * 0x400 | uVar54 >> 0x16) ^
               (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar11;
      uVar58 = (uVar18 >> 3 ^
               (uVar18 * 0x4000 | uVar18 >> 0x12) ^ (uVar18 * 0x2000000 | uVar18 >> 7)) + uVar34 +
               uVar17 + (uVar9 >> 10 ^
                        (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11));
      iVar11 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
               (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
               uVar63 + uVar58 + ((uVar37 ^ uVar13) & uVar32 ^ uVar13) + 0x2748774c;
      uVar42 = uVar42 + iVar11;
      uVar60 = ((uVar10 | uVar54) & uVar55 | uVar10 & uVar54) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar11;
      uVar16 = (uVar51 >> 3 ^
               (uVar51 * 0x4000 | uVar51 >> 0x12) ^ (uVar51 * 0x2000000 | uVar51 >> 7)) + uVar18 +
               uVar53 + (uVar38 >> 10 ^
                        (uVar38 * 0x2000 | uVar38 >> 0x13) ^ (uVar38 * 0x8000 | uVar38 >> 0x11));
      iVar11 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
               (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
               uVar13 + uVar16 + ((uVar32 ^ uVar37) & uVar42 ^ uVar37) + 0x34b0bcb5;
      uVar55 = uVar55 + iVar11;
      uVar56 = ((uVar60 | uVar10) & uVar54 | uVar60 & uVar10) +
               ((uVar60 * 0x400 | uVar60 >> 0x16) ^
               (uVar60 * 0x80000 | uVar60 >> 0xd) ^ (uVar60 * 0x40000000 | uVar60 >> 2)) + iVar11;
      uVar12 = (uVar61 >> 3 ^
               (uVar61 * 0x4000 | uVar61 >> 0x12) ^ (uVar61 * 0x2000000 | uVar61 >> 7)) + uVar51 +
               uVar22 + (uVar58 >> 10 ^
                        (uVar58 * 0x2000 | uVar58 >> 0x13) ^ (uVar58 * 0x8000 | uVar58 >> 0x11));
      iVar11 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
               (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
               uVar37 + uVar12 + ((uVar42 ^ uVar32) & uVar55 ^ uVar32) + 0x391c0cb3;
      uVar54 = uVar54 + iVar11;
      uVar37 = ((uVar56 | uVar60) & uVar10 | uVar56 & uVar60) +
               ((uVar56 * 0x400 | uVar56 >> 0x16) ^
               (uVar56 * 0x80000 | uVar56 >> 0xd) ^ (uVar56 * 0x40000000 | uVar56 >> 2)) + iVar11;
      uVar34 = (uVar62 >> 3 ^
               (uVar62 * 0x4000 | uVar62 >> 0x12) ^ (uVar62 * 0x2000000 | uVar62 >> 7)) + uVar61 +
               uVar24 + (uVar16 >> 10 ^
                        (uVar16 * 0x2000 | uVar16 >> 0x13) ^ (uVar16 * 0x8000 | uVar16 >> 0x11));
      iVar11 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
               (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
               uVar32 + uVar34 + ((uVar55 ^ uVar42) & uVar54 ^ uVar42) + 0x4ed8aa4a;
      uVar10 = uVar10 + iVar11;
      uVar59 = ((uVar37 | uVar56) & uVar60 | uVar37 & uVar56) +
               ((uVar37 * 0x400 | uVar37 >> 0x16) ^
               (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) + iVar11;
      uVar13 = (uVar21 >> 3 ^
               (uVar21 * 0x4000 | uVar21 >> 0x12) ^ (uVar21 * 0x2000000 | uVar21 >> 7)) + uVar62 +
               uVar23 + (uVar12 >> 10 ^
                        (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11));
      iVar11 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
               (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
               uVar42 + uVar13 + ((uVar54 ^ uVar55) & uVar10 ^ uVar55) + 0x5b9cca4f;
      uVar60 = uVar60 + iVar11;
      uVar42 = ((uVar59 | uVar37) & uVar56 | uVar59 & uVar37) +
               ((uVar59 * 0x400 | uVar59 >> 0x16) ^
               (uVar59 * 0x80000 | uVar59 >> 0xd) ^ (uVar59 * 0x40000000 | uVar59 >> 2)) + iVar11;
      uVar51 = (uVar64 >> 3 ^
               (uVar64 * 0x4000 | uVar64 >> 0x12) ^ (uVar64 * 0x2000000 | uVar64 >> 7)) + uVar21 +
               uVar9 + (uVar34 >> 10 ^
                       (uVar34 * 0x2000 | uVar34 >> 0x13) ^ (uVar34 * 0x8000 | uVar34 >> 0x11));
      iVar11 = ((uVar60 * 0x80 | uVar60 >> 0x19) ^
               (uVar60 * 0x200000 | uVar60 >> 0xb) ^ (uVar60 * 0x4000000 | uVar60 >> 6)) +
               uVar55 + uVar51 + ((uVar10 ^ uVar54) & uVar60 ^ uVar54) + 0x682e6ff3;
      uVar56 = uVar56 + iVar11;
      uVar32 = ((uVar42 | uVar59) & uVar37 | uVar42 & uVar59) +
               ((uVar42 * 0x400 | uVar42 >> 0x16) ^
               (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar11;
      uVar38 = (uVar47 >> 3 ^
               (uVar47 * 0x4000 | uVar47 >> 0x12) ^ (uVar47 * 0x2000000 | uVar47 >> 7)) + uVar64 +
               uVar38 + (uVar13 >> 10 ^
                        (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11));
      iVar11 = ((uVar56 * 0x80 | uVar56 >> 0x19) ^
               (uVar56 * 0x200000 | uVar56 >> 0xb) ^ (uVar56 * 0x4000000 | uVar56 >> 6)) +
               uVar54 + uVar38 + ((uVar60 ^ uVar10) & uVar56 ^ uVar10) + 0x748f82ee;
      uVar37 = uVar37 + iVar11;
      uVar54 = ((uVar32 | uVar42) & uVar59 | uVar32 & uVar42) +
               ((uVar32 * 0x400 | uVar32 >> 0x16) ^
               (uVar32 * 0x80000 | uVar32 >> 0xd) ^ (uVar32 * 0x40000000 | uVar32 >> 2)) + iVar11;
      uVar47 = (uVar19 >> 3 ^
               (uVar19 * 0x4000 | uVar19 >> 0x12) ^ (uVar19 * 0x2000000 | uVar19 >> 7)) + uVar47 +
               uVar58 + (uVar51 >> 10 ^
                        (uVar51 * 0x2000 | uVar51 >> 0x13) ^ (uVar51 * 0x8000 | uVar51 >> 0x11));
      iVar11 = ((uVar37 * 0x80 | uVar37 >> 0x19) ^
               (uVar37 * 0x200000 | uVar37 >> 0xb) ^ (uVar37 * 0x4000000 | uVar37 >> 6)) +
               uVar10 + uVar47 + ((uVar56 ^ uVar60) & uVar37 ^ uVar60) + 0x78a5636f;
      uVar59 = uVar59 + iVar11;
      uVar55 = ((uVar54 | uVar32) & uVar42 | uVar54 & uVar32) +
               ((uVar54 * 0x400 | uVar54 >> 0x16) ^
               (uVar54 * 0x80000 | uVar54 >> 0xd) ^ (uVar54 * 0x40000000 | uVar54 >> 2)) + iVar11;
      uVar10 = (uVar17 >> 3 ^
               (uVar17 * 0x4000 | uVar17 >> 0x12) ^ (uVar17 * 0x2000000 | uVar17 >> 7)) + uVar19 +
               uVar16 + (uVar38 >> 10 ^
                        (uVar38 * 0x2000 | uVar38 >> 0x13) ^ (uVar38 * 0x8000 | uVar38 >> 0x11));
      iVar11 = ((uVar59 * 0x80 | uVar59 >> 0x19) ^
               (uVar59 * 0x200000 | uVar59 >> 0xb) ^ (uVar59 * 0x4000000 | uVar59 >> 6)) +
               uVar60 + uVar10 + ((uVar37 ^ uVar56) & uVar59 ^ uVar56) + -0x7b3787ec;
      uVar42 = uVar42 + iVar11;
      uVar16 = ((uVar55 | uVar54) & uVar32 | uVar55 & uVar54) +
               ((uVar55 * 0x400 | uVar55 >> 0x16) ^
               (uVar55 * 0x80000 | uVar55 >> 0xd) ^ (uVar55 * 0x40000000 | uVar55 >> 2)) + iVar11;
      uVar12 = (uVar53 >> 3 ^
               (uVar53 * 0x4000 | uVar53 >> 0x12) ^ (uVar53 * 0x2000000 | uVar53 >> 7)) + uVar17 +
               uVar12 + (uVar47 >> 10 ^
                        (uVar47 * 0x2000 | uVar47 >> 0x13) ^ (uVar47 * 0x8000 | uVar47 >> 0x11));
      iVar11 = ((uVar42 * 0x80 | uVar42 >> 0x19) ^
               (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6)) +
               uVar56 + uVar12 + ((uVar59 ^ uVar37) & uVar42 ^ uVar37) + -0x7338fdf8;
      uVar32 = uVar32 + iVar11;
      uVar47 = ((uVar16 | uVar55) & uVar54 | uVar16 & uVar55) +
               ((uVar16 * 0x400 | uVar16 >> 0x16) ^
               (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar11;
      uVar53 = (uVar22 >> 3 ^
               (uVar22 * 0x4000 | uVar22 >> 0x12) ^ (uVar22 * 0x2000000 | uVar22 >> 7)) + uVar53 +
               uVar34 + (uVar10 >> 10 ^
                        (uVar10 * 0x2000 | uVar10 >> 0x13) ^ (uVar10 * 0x8000 | uVar10 >> 0x11));
      iVar11 = ((uVar32 * 0x80 | uVar32 >> 0x19) ^
               (uVar32 * 0x200000 | uVar32 >> 0xb) ^ (uVar32 * 0x4000000 | uVar32 >> 6)) +
               uVar37 + uVar53 + ((uVar42 ^ uVar59) & uVar32 ^ uVar59) + -0x6f410006;
      uVar54 = uVar54 + iVar11;
      uVar17 = ((uVar47 | uVar16) & uVar55 | uVar47 & uVar16) +
               ((uVar47 * 0x400 | uVar47 >> 0x16) ^
               (uVar47 * 0x80000 | uVar47 >> 0xd) ^ (uVar47 * 0x40000000 | uVar47 >> 2)) + iVar11;
      uVar12 = (uVar24 >> 3 ^
               (uVar24 * 0x4000 | uVar24 >> 0x12) ^ (uVar24 * 0x2000000 | uVar24 >> 7)) + uVar22 +
               uVar13 + (uVar12 >> 10 ^
                        (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11));
      iVar11 = ((uVar54 * 0x80 | uVar54 >> 0x19) ^
               (uVar54 * 0x200000 | uVar54 >> 0xb) ^ (uVar54 * 0x4000000 | uVar54 >> 6)) +
               uVar59 + uVar12 + ((uVar32 ^ uVar42) & uVar54 ^ uVar42) + -0x5baf9315;
      uVar55 = uVar55 + iVar11;
      uVar10 = ((uVar17 | uVar47) & uVar16 | uVar17 & uVar47) +
               ((uVar17 * 0x400 | uVar17 >> 0x16) ^
               (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar11;
      iVar11 = ((uVar55 * 0x80 | uVar55 >> 0x19) ^
               (uVar55 * 0x200000 | uVar55 >> 0xb) ^ (uVar55 * 0x4000000 | uVar55 >> 6)) +
               (uVar23 >> 3 ^
               (uVar23 * 0x4000 | uVar23 >> 0x12) ^ (uVar23 * 0x2000000 | uVar23 >> 7)) + uVar24 +
               uVar51 + (uVar53 >> 10 ^
                        (uVar53 * 0x2000 | uVar53 >> 0x13) ^ (uVar53 * 0x8000 | uVar53 >> 0x11)) +
               uVar42 + ((uVar54 ^ uVar32) & uVar55 ^ uVar32) + -0x41065c09;
      uVar16 = uVar16 + iVar11;
      uVar37 = ((uVar10 | uVar17) & uVar47 | uVar10 & uVar17) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar11;
      iVar11 = ((uVar16 * 0x80 | uVar16 >> 0x19) ^
               (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
               (uVar9 >> 3 ^ (uVar9 * 0x4000 | uVar9 >> 0x12) ^ (uVar9 * 0x2000000 | uVar9 >> 7)) +
               uVar23 + uVar38 +
               (uVar12 >> 10 ^
               (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11)) + uVar32 +
               ((uVar55 ^ uVar54) & uVar16 ^ uVar54) + -0x398e870e;
      hash->s[0] = ((uVar37 | uVar10) & uVar17 | uVar37 & uVar10) + uVar1 +
                   ((uVar37 * 0x400 | uVar37 >> 0x16) ^
                   (uVar37 * 0x80000 | uVar37 >> 0xd) ^ (uVar37 * 0x40000000 | uVar37 >> 2)) +
                   iVar11;
      hash->s[1] = uVar37 + uVar2;
      hash->s[2] = uVar10 + uVar3;
      hash->s[3] = uVar17 + uVar4;
      hash->s[4] = uVar47 + uVar5 + iVar11;
      hash->s[5] = uVar16 + uVar6;
      hash->s[6] = uVar55 + uVar7;
      hash->s[7] = uVar54 + uVar8;
      __n = 0x40;
      uVar35 = 0;
    } while (0x3f < len);
  }
  if (len == 0) {
    return;
  }
  memcpy(hash->buf + local_a8,data,len);
  return;
}

Assistant:

static void secp256k1_sha256_write(secp256k1_sha256 *hash, const unsigned char *data, size_t len) {
    size_t bufsize = hash->bytes & 0x3F;
    hash->bytes += len;
    VERIFY_CHECK(hash->bytes >= len);
    while (len >= 64 - bufsize) {
        /* Fill the buffer, and process it. */
        size_t chunk_len = 64 - bufsize;
        memcpy(hash->buf + bufsize, data, chunk_len);
        data += chunk_len;
        len -= chunk_len;
        secp256k1_sha256_transform(hash->s, hash->buf);
        bufsize = 0;
    }
    if (len) {
        /* Fill the buffer with what remains. */
        memcpy(((unsigned char*)hash->buf) + bufsize, data, len);
    }
}